

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<TestResult_(mp::NumericConstant)>::FunctionMockerBase
          (FunctionMockerBase<TestResult_(mp::NumericConstant)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<TestResult_(mp::NumericConstant)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0029f158;
  MockSpec<TestResult_(mp::NumericConstant)>::MockSpec
            ((MockSpec<TestResult_(mp::NumericConstant)> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}